

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-traverse.c
# Opt level: O0

void print_full_field_name(FILE *f,int print_dims,int compound_as_array)

{
  int iVar1;
  int local_30;
  int local_2c;
  coda_type_class type_class_1;
  int array_id_1;
  coda_type_class type_class;
  int array_id;
  int record_id;
  int i;
  int compound_as_array_local;
  int print_dims_local;
  FILE *f_local;
  
  record_id = compound_as_array;
  _compound_as_array_local = (FILE *)f;
  if (print_dims == 1) {
    type_class = coda_record_class;
    array_id_1 = 0;
    i = 1;
    for (array_id = 0; array_id < traverse_info.current_depth; array_id = array_id + 1) {
      iVar1 = coda_type_get_class(traverse_info.type[array_id],&type_class_1);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      if (type_class_1 == coda_record_class) {
        fprintf(_compound_as_array_local,"/%s",traverse_info.field_name[(int)type_class]);
        type_class = type_class + coda_array_class;
      }
      else if (type_class_1 == coda_array_class) {
        if (array_id == 0) {
          fprintf(_compound_as_array_local,"/");
        }
        if (0 < traverse_info.array_info[array_id_1].num_dims) {
          fprintf(_compound_as_array_local,"[");
          print_array_dim((FILE *)_compound_as_array_local,array_id_1);
          fprintf(_compound_as_array_local,"]");
        }
        array_id_1 = array_id_1 + 1;
      }
    }
    if ((record_id != 0) && (array_id_1 < traverse_info.num_arrays)) {
      fprintf(_compound_as_array_local,"[");
      print_array_dim((FILE *)_compound_as_array_local,array_id_1);
      fprintf(_compound_as_array_local,"]");
    }
  }
  else {
    i = print_dims;
    for (array_id = 0; array_id < traverse_info.num_records; array_id = array_id + 1) {
      if (0 < array_id) {
        fprintf(_compound_as_array_local,".");
      }
      fprintf(_compound_as_array_local,"%s",traverse_info.field_name[array_id]);
    }
    if (i == 2) {
      local_2c = 0;
      for (array_id = 0; array_id < traverse_info.current_depth; array_id = array_id + 1) {
        iVar1 = coda_type_get_class(traverse_info.type[array_id],&local_30);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        if ((local_30 == 1) && (0 < traverse_info.array_info[local_2c].num_dims)) {
          if (traverse_info.array_info[local_2c].dim_id == 0) {
            fprintf(_compound_as_array_local," [");
          }
          else {
            fprintf(_compound_as_array_local,",");
          }
          print_array_dim((FILE *)_compound_as_array_local,local_2c);
          local_2c = local_2c + 1;
        }
      }
      if ((record_id != 0) && (local_2c < traverse_info.num_arrays)) {
        if (traverse_info.array_info[local_2c].dim_id == 0) {
          fprintf(_compound_as_array_local," [");
        }
        else {
          fprintf(_compound_as_array_local,",");
        }
        print_array_dim((FILE *)_compound_as_array_local,local_2c);
        local_2c = local_2c + 1;
      }
      if (0 < local_2c) {
        fprintf(_compound_as_array_local,"]");
      }
    }
  }
  return;
}

Assistant:

void print_full_field_name(FILE *f, int print_dims, int compound_as_array)
{
    int i;

    if (print_dims == 1)
    {
        int record_id = 0;
        int array_id = 0;

        for (i = 0; i < traverse_info.current_depth; i++)
        {
            coda_type_class type_class;

            if (coda_type_get_class(traverse_info.type[i], &type_class) != 0)
            {
                handle_coda_error();
            }
            switch (type_class)
            {
                case coda_record_class:
                    fprintf(f, "/%s", traverse_info.field_name[record_id]);
                    record_id++;
                    break;
                case coda_array_class:
                    if (i == 0)
                    {
                        fprintf(f, "/");
                    }
                    if (traverse_info.array_info[array_id].num_dims > 0)
                    {
                        fprintf(f, "[");
                        print_array_dim(f, array_id);
                        fprintf(f, "]");
                    }
                    array_id++;
                    break;
                default:
                    break;
            }
        }
        if (compound_as_array && array_id < traverse_info.num_arrays)
        {
            fprintf(f, "[");
            print_array_dim(f, array_id);
            fprintf(f, "]");
        }
    }
    else
    {
        for (i = 0; i < traverse_info.num_records; i++)
        {
            if (i > 0)
            {
                fprintf(f, ".");
            }
            fprintf(f, "%s", traverse_info.field_name[i]);
        }

        if (print_dims == 2)
        {
            int array_id = 0;

            for (i = 0; i < traverse_info.current_depth; i++)
            {
                coda_type_class type_class;

                if (coda_type_get_class(traverse_info.type[i], &type_class) != 0)
                {
                    handle_coda_error();
                }
                if (type_class == coda_array_class)
                {
                    if (traverse_info.array_info[array_id].num_dims > 0)
                    {
                        if (traverse_info.array_info[array_id].dim_id == 0)
                        {
                            fprintf(f, " [");
                        }
                        else
                        {
                            fprintf(f, ",");
                        }
                        print_array_dim(f, array_id);
                        array_id++;
                    }
                }
            }
            if (compound_as_array && array_id < traverse_info.num_arrays)
            {
                if (traverse_info.array_info[array_id].dim_id == 0)
                {
                    fprintf(f, " [");
                }
                else
                {
                    fprintf(f, ",");
                }
                print_array_dim(f, array_id);
                array_id++;
            }
            if (array_id > 0)
            {
                fprintf(f, "]");
            }
        }
    }
}